

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnI64ConstExpr(BinaryReaderIR *this,uint64_t value)

{
  char *__s;
  Offset OVar1;
  Result RVar2;
  Const local_90;
  char *local_58;
  Location loc;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.field_1.field_0.line = 0;
  loc.filename.data_ = (char *)strlen(__s);
  local_58 = __s;
  loc.filename.size_ = OVar1;
  Const::Const(&local_90,value,&local_58);
  loc.field_1._8_8_ = operator_new(0x78);
  *(undefined8 *)(loc.field_1._8_8_ + 8) = 0;
  *(undefined8 *)(loc.field_1._8_8_ + 0x10) = 0;
  *(undefined8 *)(loc.field_1._8_8_ + 0x18) = 0;
  *(undefined8 *)(loc.field_1._8_8_ + 0x20) = 0;
  *(undefined8 *)(loc.field_1._8_8_ + 0x24) = 0;
  *(undefined8 *)(loc.field_1._8_8_ + 0x2c) = 0;
  *(undefined4 *)(loc.field_1._8_8_ + 0x38) = 0xe;
  *(undefined ***)loc.field_1._8_8_ = &PTR__Expr_01544e68;
  *(char **)(loc.field_1._8_8_ + 0x40) = local_90.loc.filename.data_;
  *(size_type *)(loc.field_1._8_8_ + 0x48) = local_90.loc.filename.size_;
  ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
  (loc.field_1._8_8_ + 0x50))->offset = (size_t)local_90.loc.field_1.field_1.offset;
  *(undefined8 *)(loc.field_1._8_8_ + 0x58) = local_90.loc.field_1._8_8_;
  *(undefined8 *)(loc.field_1._8_8_ + 0x60) = local_90._32_8_;
  *(uint64_t *)(loc.field_1._8_8_ + 0x68) = local_90.field_2.u64;
  *(undefined8 *)(loc.field_1._8_8_ + 0x70) = local_90.field_2._8_8_;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                          ((long)&loc.field_1 + 8));
  if (loc.field_1._8_8_ != 0) {
    (**(code **)(*(long *)loc.field_1._8_8_ + 8))();
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnI64ConstExpr(uint64_t value) {
  return AppendExpr(MakeUnique<ConstExpr>(Const::I64(value, GetLocation())));
}